

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

CAmount wallet::TxGetCredit(CWallet *wallet,CTransaction *tx,isminefilter *filter)

{
  pointer pCVar1;
  CAmount CVar2;
  runtime_error *this;
  pointer txout;
  ulong uVar3;
  long in_FS_OFFSET;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  txout = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start;
  pCVar1 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = 0;
  do {
    if (txout == pCVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar3;
      }
      goto LAB_00923290;
    }
    CVar2 = OutputGetCredit(wallet,txout,filter);
    uVar3 = uVar3 + CVar2;
    txout = txout + 1;
  } while (uVar3 < 0x775f05a074001);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"TxGetCredit",&local_79);
  std::operator+(&local_58,&local_78,": value out of range");
  std::runtime_error::runtime_error(this,(string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00923290:
  __stack_chk_fail();
}

Assistant:

CAmount TxGetCredit(const CWallet& wallet, const CTransaction& tx, const isminefilter& filter)
{
    CAmount nCredit = 0;
    for (const CTxOut& txout : tx.vout)
    {
        nCredit += OutputGetCredit(wallet, txout, filter);
        if (!MoneyRange(nCredit))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
    }
    return nCredit;
}